

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

void ot::commissioner::DtlsSession::DtlsTimer::SetDelay
               (void *aDtlsTimer,uint32_t aIntermediate,uint32_t aFinish)

{
  long lVar1;
  Duration aDelay;
  
  if (aFinish != 0) {
    *(undefined1 *)((long)aDtlsTimer + 0xb8) = 0;
    aDelay.__r._4_4_ = 0;
    aDelay.__r._0_4_ = aFinish;
    Timer::Start((Timer *)aDtlsTimer,aDelay);
    lVar1 = std::chrono::_V2::system_clock::now();
    *(ulong *)((long)aDtlsTimer + 0xb0) = (ulong)aIntermediate * 1000000 + lVar1;
    return;
  }
  *(undefined1 *)((long)aDtlsTimer + 0xb8) = 1;
  Timer::Stop((Timer *)aDtlsTimer);
  return;
}

Assistant:

void DtlsSession::DtlsTimer::SetDelay(void *aDtlsTimer, uint32_t aIntermediate, uint32_t aFinish)
{
    auto timer = reinterpret_cast<DtlsTimer *>(aDtlsTimer);

    if (aFinish == 0)
    {
        timer->mCancelled = true;
        timer->Stop();
    }
    else
    {
        timer->mCancelled = false;
        timer->Start(std::chrono::milliseconds(aFinish));
        timer->mIntermediate = Clock::now() + std::chrono::milliseconds(aIntermediate);
    }
}